

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void gl4cts::EnhancedLayouts::Utils::Program::Uniform
               (Functions *gl,Type *type,GLsizei count,GLint location,GLvoid *data)

{
  GLenum err;
  uniformNfv p_Var1;
  uniformNiv p_Var2;
  uniformNuiv p_Var3;
  uniformNdv p_Var4;
  uniformMatrixNfv p_Var5;
  uniformMatrixNdv p_Var6;
  TestError *this;
  int line;
  char *msg;
  
  if (location != -1) {
    switch(type->m_basic_type) {
    case Float:
      if (type->m_n_columns == 1) {
        p_Var1 = getUniformNfv(gl,type->m_n_rows);
        (*p_Var1)(location,count,(GLfloat *)data);
        err = (*gl->getError)();
        msg = "UniformNfv";
        line = 0xbae;
      }
      else {
        p_Var5 = getUniformMatrixNfv(gl,type->m_n_columns,type->m_n_rows);
        (*p_Var5)(location,count,'\0',(GLfloat *)data);
        err = (*gl->getError)();
        msg = "UniformMatrixNfv";
        line = 0xbb3;
      }
      break;
    case Double:
      if (type->m_n_columns == 1) {
        p_Var4 = getUniformNdv(gl,type->m_n_rows);
        (*p_Var4)(location,count,(GLdouble *)data);
        err = (*gl->getError)();
        msg = "UniformNdv";
        line = 0xba2;
      }
      else {
        p_Var6 = getUniformMatrixNdv(gl,type->m_n_columns,type->m_n_rows);
        (*p_Var6)(location,count,'\0',(GLdouble *)data);
        err = (*gl->getError)();
        msg = "UniformMatrixNdv";
        line = 0xba7;
      }
      break;
    case Int:
      p_Var2 = getUniformNiv(gl,type->m_n_rows);
      (*p_Var2)(location,count,(GLint *)data);
      err = (*gl->getError)();
      msg = "UniformNiv";
      line = 3000;
      break;
    case Uint:
      p_Var3 = getUniformNuiv(gl,type->m_n_rows);
      (*p_Var3)(location,count,(GLuint *)data);
      err = (*gl->getError)();
      msg = "UniformNuiv";
      line = 0xbbc;
      break;
    default:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0xbbf);
      goto LAB_00958b76;
    }
    glu::checkError(err,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                    ,line);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Uniform is inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0xb99);
LAB_00958b76:
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Program::Uniform(const Functions& gl, const Type& type, GLsizei count, GLint location, const GLvoid* data)
{
	if (-1 == location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	switch (type.m_basic_type)
	{
	case Type::Double:
		if (1 == type.m_n_columns)
		{
			getUniformNdv(gl, type.m_n_rows)(location, count, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNdv");
		}
		else
		{
			getUniformMatrixNdv(gl, type.m_n_columns, type.m_n_rows)(location, count, false, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNdv");
		}
		break;
	case Type::Float:
		if (1 == type.m_n_columns)
		{
			getUniformNfv(gl, type.m_n_rows)(location, count, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNfv");
		}
		else
		{
			getUniformMatrixNfv(gl, type.m_n_columns, type.m_n_rows)(location, count, false, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNfv");
		}
		break;
	case Type::Int:
		getUniformNiv(gl, type.m_n_rows)(location, count, (const GLint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNiv");
		break;
	case Type::Uint:
		getUniformNuiv(gl, type.m_n_rows)(location, count, (const GLuint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNuiv");
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}